

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

void sc_core::sc_report_handler::default_handler(sc_report *rep,sc_actions *actions)

{
  bool bVar1;
  sc_severity sVar2;
  ostream *poVar3;
  char *pcVar4;
  sc_process_b *this;
  undefined8 uVar5;
  uint *in_RSI;
  sc_report *in_RDI;
  sc_report *in_stack_00000058;
  sc_process_b *proc_p;
  sc_time *in_stack_ffffffffffffff38;
  sc_log_file_handle *in_stack_ffffffffffffff40;
  sc_report *in_stack_ffffffffffffffa0;
  string local_30 [32];
  uint *local_10;
  sc_report *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((*in_RSI & 8) != 0) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    sc_report_compose_message_abi_cxx11_(in_stack_00000058);
    poVar3 = std::operator<<(poVar3,local_30);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  if (((*local_10 & 4) != 0) && (pcVar4 = get_log_file_name(), pcVar4 != (char *)0x0)) {
    get_log_file_name();
    sc_log_file_handle::update_file_name
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    sc_log_file_handle::operator*((sc_log_file_handle *)log_stream);
    sc_report::get_time(local_8);
    poVar3 = sc_core::operator<<((ostream *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    poVar3 = std::operator<<(poVar3,": ");
    sc_report_compose_message_abi_cxx11_(in_stack_00000058);
    poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffffa0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  if ((*local_10 & 0x40) != 0) {
    pcVar4 = sc_report::get_msg_type(local_8);
    sVar2 = sc_report::get_severity(local_8);
    sc_stop_here(pcVar4,sVar2);
    sc_stop();
  }
  if ((*local_10 & 0x20) != 0) {
    pcVar4 = sc_report::get_msg_type(local_8);
    sVar2 = sc_report::get_severity(local_8);
    sc_interrupt_here(pcVar4,sVar2);
  }
  if ((*local_10 & 0x80) == 0) {
    if ((*local_10 & 2) == 0) {
      return;
    }
    this = sc_get_current_process_b();
    if ((this != (sc_process_b *)0x0) && (bVar1 = sc_process_b::is_unwinding(this), bVar1)) {
      sc_process_b::clear_unwinding(this);
    }
    uVar5 = __cxa_allocate_exception(0x50);
    sc_report::sc_report(in_stack_ffffffffffffffa0,(sc_report *)this);
    __cxa_throw(uVar5,&sc_report::typeinfo,sc_report::~sc_report);
  }
  sc_abort();
}

Assistant:

void sc_report_handler::default_handler(const sc_report& rep,
					const sc_actions& actions)
{
    if ( actions & SC_DISPLAY )
	::std::cout << ::std::endl << sc_report_compose_message(rep) << 
		::std::endl;

    if ( (actions & SC_LOG) && get_log_file_name() )
    {
		log_stream.update_file_name(get_log_file_name());

	*log_stream << rep.get_time() << ": "
	    << sc_report_compose_message(rep) << ::std::endl;
    }
    if ( actions & SC_STOP )
    {
	sc_stop_here(rep.get_msg_type(), rep.get_severity());
	sc_stop();
    }
    if ( actions & SC_INTERRUPT )
	sc_interrupt_here(rep.get_msg_type(), rep.get_severity());

    if ( actions & SC_ABORT )
        sc_abort();

    if ( actions & SC_THROW ) {
        sc_process_b* proc_p = sc_get_current_process_b();
        if( proc_p && proc_p->is_unwinding() )
            proc_p->clear_unwinding();
        throw rep; 
    }
}